

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# checkqueue_tests.cpp
# Opt level: O2

void __thiscall
checkqueue_tests::test_CheckQueue_UniqueCheck::test_method(test_CheckQueue_UniqueCheck *this)

{
  long lVar1;
  int iVar2;
  size_type sVar3;
  size_t k;
  ulong uVar4;
  iterator pvVar5;
  iterator pvVar6;
  CCheckQueueControl<UniqueCheck> *pCVar7;
  size_t sVar8;
  long in_FS_OFFSET;
  bool bVar9;
  const_string file;
  const_string file_00;
  const_string msg;
  const_string msg_00;
  size_t *psVar10;
  char *pcVar11;
  char *local_108;
  char *local_100;
  char *local_f8;
  char *local_f0;
  undefined1 *local_e8;
  undefined1 *local_e0;
  char *local_d8;
  char *local_d0;
  char *local_c8;
  char *local_c0;
  vector<FakeCheckCheckCompletion,_std::allocator<FakeCheckCheckCompletion>_> vChecks;
  undefined1 *local_98;
  undefined1 *local_90;
  char *local_88;
  char *local_80;
  size_t total;
  size_t COUNT;
  __single_object queue;
  CCheckQueueControl<UniqueCheck> control;
  shared_count sStack_50;
  UniqueLock<AnnotatedMixin<std::mutex>_> criticalblock13;
  
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  std::make_unique<CCheckQueue<UniqueCheck>,unsigned_int_const&,int_const&>
            ((uint *)&queue,(int *)&QUEUE_BATCH_SIZE);
  COUNT = 100000;
  total = 100000;
  CCheckQueueControl<UniqueCheck>::CCheckQueueControl
            (&control,(CCheckQueue<FakeCheckCheckCompletion> *)
                      queue._M_t.
                      super___uniq_ptr_impl<CCheckQueue<UniqueCheck>,_std::default_delete<CCheckQueue<UniqueCheck>_>_>
                      ._M_t.
                      super__Tuple_impl<0UL,_CCheckQueue<UniqueCheck>_*,_std::default_delete<CCheckQueue<UniqueCheck>_>_>
                      .super__Head_base<0UL,_CCheckQueue<UniqueCheck>_*,_false>._M_head_impl);
  sVar8 = 100000;
  while (sVar8 != 0) {
    iVar2 = RandomMixin<FastRandomContext>::randrange<int>
                      (&(this->super_BOOST_AUTO_TEST_CASE_FIXTURE).super_NoLockLoggingTestingSetup.
                        super_TestingSetup.super_ChainTestingSetup.super_BasicTestingSetup.m_rng.
                        super_RandomMixin<FastRandomContext>,10);
    vChecks.super__Vector_base<FakeCheckCheckCompletion,_std::allocator<FakeCheckCheckCompletion>_>.
    _M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
    vChecks.super__Vector_base<FakeCheckCheckCompletion,_std::allocator<FakeCheckCheckCompletion>_>.
    _M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
    vChecks.super__Vector_base<FakeCheckCheckCompletion,_std::allocator<FakeCheckCheckCompletion>_>.
    _M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    uVar4 = 0;
    while ((uVar4 < (ulong)(long)iVar2 && (total != 0))) {
      total = total - 1;
      std::vector<UniqueCheck,std::allocator<UniqueCheck>>::emplace_back<unsigned_long&>
                ((vector<UniqueCheck,std::allocator<UniqueCheck>> *)&vChecks,&total);
      uVar4 = uVar4 + 1;
    }
    CCheckQueueControl<UniqueCheck>::Add(&control,&vChecks);
    std::_Vector_base<UniqueCheck,_std::allocator<UniqueCheck>_>::~_Vector_base
              ((_Vector_base<UniqueCheck,_std::allocator<UniqueCheck>_> *)&vChecks);
    sVar8 = total;
  }
  CCheckQueueControl<UniqueCheck>::~CCheckQueueControl(&control);
  pvVar5 = (iterator)0x11b;
  pvVar6 = (iterator)0x0;
  UniqueLock<AnnotatedMixin<std::mutex>_>::UniqueLock
            (&criticalblock13,&UniqueCheck::m,"UniqueCheck::m",
             "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/checkqueue_tests.cpp"
             ,0x11b,false);
  local_88 = 
  "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/checkqueue_tests.cpp"
  ;
  local_80 = "";
  local_98 = &boost::unit_test::basic_cstring<char_const>::null;
  local_90 = &boost::unit_test::basic_cstring<char_const>::null;
  file.m_end = (iterator)0x11d;
  file.m_begin = (iterator)&local_88;
  msg.m_end = pvVar6;
  msg.m_begin = pvVar5;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,file,(size_t)&local_98,msg);
  vChecks.super__Vector_base<FakeCheckCheckCompletion,_std::allocator<FakeCheckCheckCompletion>_>.
  _M_impl.super__Vector_impl_data._M_finish =
       (pointer)((ulong)vChecks.
                        super__Vector_base<FakeCheckCheckCompletion,_std::allocator<FakeCheckCheckCompletion>_>
                        ._M_impl.super__Vector_impl_data._M_finish & 0xffffffffffffff00);
  vChecks.super__Vector_base<FakeCheckCheckCompletion,_std::allocator<FakeCheckCheckCompletion>_>.
  _M_impl.super__Vector_impl_data._M_start = (pointer)&PTR__lazy_ostream_011480b0;
  vChecks.super__Vector_base<FakeCheckCheckCompletion,_std::allocator<FakeCheckCheckCompletion>_>.
  _M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)boost::unit_test::lazy_ostream::inst;
  local_c8 = 
  "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/checkqueue_tests.cpp"
  ;
  local_c0 = "";
  pCVar7 = &control;
  control.pqueue =
       (CCheckQueue<FakeCheckCheckCompletion> *)UniqueCheck::results._M_h._M_element_count;
  pcVar11 = "COUNT";
  psVar10 = &COUNT;
  pvVar5 = (iterator)0x2;
  boost::test_tools::tt_detail::
  check_frwd<boost::test_tools::tt_detail::equal_impl_frwd,unsigned_long,unsigned_long>
            (&vChecks,&local_c8,0x11d);
  bVar9 = true;
  for (vChecks.
       super__Vector_base<FakeCheckCheckCompletion,_std::allocator<FakeCheckCheckCompletion>_>.
       _M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
      vChecks.
      super__Vector_base<FakeCheckCheckCompletion,_std::allocator<FakeCheckCheckCompletion>_>.
      _M_impl.super__Vector_impl_data._M_start < COUNT;
      vChecks.
      super__Vector_base<FakeCheckCheckCompletion,_std::allocator<FakeCheckCheckCompletion>_>.
      _M_impl.super__Vector_impl_data._M_start =
           vChecks.
           super__Vector_base<FakeCheckCheckCompletion,_std::allocator<FakeCheckCheckCompletion>_>.
           _M_impl.super__Vector_impl_data._M_start + 1) {
    if (bVar9) {
      sVar3 = std::
              _Hashtable<unsigned_long,_unsigned_long,_std::allocator<unsigned_long>,_std::__detail::_Identity,_std::equal_to<unsigned_long>,_std::hash<unsigned_long>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_true,_false>_>
              ::count(&UniqueCheck::results._M_h,(key_type *)&vChecks);
      bVar9 = sVar3 == 1;
    }
    else {
      bVar9 = false;
    }
  }
  local_d8 = 
  "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/checkqueue_tests.cpp"
  ;
  local_d0 = "";
  local_e8 = &boost::unit_test::basic_cstring<char_const>::null;
  local_e0 = &boost::unit_test::basic_cstring<char_const>::null;
  file_00.m_end = (iterator)0x121;
  file_00.m_begin = (iterator)&local_d8;
  msg_00.m_end = (iterator)pCVar7;
  msg_00.m_begin = pvVar5;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,file_00,(size_t)&local_e8,msg_00
            );
  control.pqueue = (CCheckQueue<FakeCheckCheckCompletion> *)CONCAT71(control.pqueue._1_7_,bVar9);
  control.fDone = false;
  control._9_7_ = 0;
  sStack_50.pi_ = (sp_counted_base *)0x0;
  local_f8 = "r";
  local_f0 = "";
  vChecks.super__Vector_base<FakeCheckCheckCompletion,_std::allocator<FakeCheckCheckCompletion>_>.
  _M_impl.super__Vector_impl_data._M_finish =
       (pointer)((ulong)vChecks.
                        super__Vector_base<FakeCheckCheckCompletion,_std::allocator<FakeCheckCheckCompletion>_>
                        ._M_impl.super__Vector_impl_data._M_finish & 0xffffffffffffff00);
  vChecks.super__Vector_base<FakeCheckCheckCompletion,_std::allocator<FakeCheckCheckCompletion>_>.
  _M_impl.super__Vector_impl_data._M_start = (pointer)&PTR__lazy_ostream_011481f0;
  vChecks.super__Vector_base<FakeCheckCheckCompletion,_std::allocator<FakeCheckCheckCompletion>_>.
  _M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)boost::unit_test::lazy_ostream::inst;
  local_108 = 
  "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/checkqueue_tests.cpp"
  ;
  local_100 = "";
  boost::test_tools::tt_detail::report_assertion
            ((assertion_result *)&control,(lazy_ostream *)&vChecks,2,0,WARN,(check_type)psVar10,
             (size_t)&local_108,0x121,pcVar11);
  boost::detail::shared_count::~shared_count(&sStack_50);
  std::unique_lock<std::mutex>::~unique_lock(&criticalblock13.super_unique_lock);
  std::unique_ptr<CCheckQueue<UniqueCheck>,_std::default_delete<CCheckQueue<UniqueCheck>_>_>::
  ~unique_ptr(&queue);
  if (*(long *)(in_FS_OFFSET + 0x28) == lVar1) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

BOOST_AUTO_TEST_CASE(test_CheckQueue_UniqueCheck)
{
    auto queue = std::make_unique<Unique_Queue>(QUEUE_BATCH_SIZE, SCRIPT_CHECK_THREADS);
    size_t COUNT = 100000;
    size_t total = COUNT;
    {
        CCheckQueueControl<UniqueCheck> control(queue.get());
        while (total) {
            size_t r = m_rng.randrange(10);
            std::vector<UniqueCheck> vChecks;
            for (size_t k = 0; k < r && total; k++)
                vChecks.emplace_back(--total);
            control.Add(std::move(vChecks));
        }
    }
    {
        LOCK(UniqueCheck::m);
        bool r = true;
        BOOST_REQUIRE_EQUAL(UniqueCheck::results.size(), COUNT);
        for (size_t i = 0; i < COUNT; ++i) {
            r = r && UniqueCheck::results.count(i) == 1;
        }
        BOOST_REQUIRE(r);
    }
}